

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O3

void opj_t1_dec_sigpass_step_raw
               (opj_t1_t *t1,opj_flag_t *flagsp,OPJ_INT32 *datap,OPJ_INT32 oneplushalf,
               OPJ_UINT32 vsc,OPJ_UINT32 ci)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  int iVar5;
  opj_mqc_t *mqc;
  OPJ_UINT32 OVar6;
  uint uVar7;
  bool bVar8;
  OPJ_UINT32 OVar4;
  
  bVar2 = (char)ci * '\x03';
  if (((*flagsp >> (bVar2 & 0x1f) & 0x200010) == 0) && ((*flagsp >> (bVar2 & 0x1f) & 0x1ef) != 0)) {
    OVar6 = (t1->mqc).c;
    OVar4 = (t1->mqc).ct;
    if (OVar4 == 0) {
      pbVar1 = (t1->mqc).bp;
      bVar8 = OVar6 == 0xff;
      OVar6 = (OPJ_UINT32)*pbVar1;
      if (bVar8) {
        if (*pbVar1 < 0x90) {
          (t1->mqc).c = OVar6;
          (t1->mqc).bp = pbVar1 + 1;
          OVar4 = 7;
        }
        else {
          (t1->mqc).c = 0xff;
          OVar4 = 8;
          OVar6 = 0xff;
        }
      }
      else {
        (t1->mqc).c = OVar6;
        (t1->mqc).bp = pbVar1 + 1;
        OVar4 = 8;
      }
    }
    uVar3 = OVar4 - 1;
    (t1->mqc).ct = uVar3;
    if ((OVar6 >> (uVar3 & 0x1f) & 1) != 0) {
      if (uVar3 == 0) {
        pbVar1 = (t1->mqc).bp;
        bVar8 = OVar6 == 0xff;
        OVar6 = (OPJ_UINT32)*pbVar1;
        if (bVar8) {
          if (*pbVar1 < 0x90) {
            (t1->mqc).c = OVar6;
            (t1->mqc).bp = pbVar1 + 1;
            uVar3 = 7;
          }
          else {
            (t1->mqc).c = 0xff;
            uVar3 = 8;
            OVar6 = 0xff;
          }
        }
        else {
          (t1->mqc).c = OVar6;
          (t1->mqc).bp = pbVar1 + 1;
          uVar3 = 8;
        }
      }
      (t1->mqc).ct = uVar3 - 1;
      bVar8 = (OVar6 >> (uVar3 - 1 & 0x1f) & 1) != 0;
      iVar5 = -oneplushalf;
      if (!bVar8) {
        iVar5 = oneplushalf;
      }
      *datap = iVar5;
      OVar6 = t1->w;
      flagsp[-1] = flagsp[-1] | 0x20 << (bVar2 & 0x1f);
      uVar3 = OVar6 + 2;
      uVar7 = (uint)bVar8;
      *flagsp = *flagsp | (uVar7 << 0x13 | 0x10) << (bVar2 & 0x1f);
      flagsp[1] = flagsp[1] | 8 << (bVar2 & 0x1f);
      if (vsc == 0 && ci == 0) {
        *(ulong *)(flagsp + (-1 - (ulong)uVar3)) =
             CONCAT44(uVar7 << 0x1f,0x20000) | 0x1000000000000 |
             *(ulong *)(flagsp + (-1 - (ulong)uVar3));
        pbVar1 = (byte *)((long)flagsp + (ulong)uVar3 * -4 + 5);
        *pbVar1 = *pbVar1 | 0x80;
      }
      if (ci == 3) {
        *(ulong *)(flagsp + ((ulong)uVar3 - 1)) =
             CONCAT44(uVar7 << 0x12,4) | 0x200000000 | *(ulong *)(flagsp + ((ulong)uVar3 - 1));
        *(byte *)(flagsp + (ulong)uVar3 + 1) = (byte)flagsp[(ulong)uVar3 + 1] | 1;
      }
    }
    *flagsp = *flagsp | 0x200000 << (bVar2 & 0x1f);
    return;
  }
  return;
}

Assistant:

static INLINE void opj_t1_dec_sigpass_step_raw(
    opj_t1_t *t1,
    opj_flag_t *flagsp,
    OPJ_INT32 *datap,
    OPJ_INT32 oneplushalf,
    OPJ_UINT32 vsc,
    OPJ_UINT32 ci)
{
    OPJ_UINT32 v;
    opj_mqc_t *mqc = &(t1->mqc);       /* RAW component */

    OPJ_UINT32 const flags = *flagsp;

    if ((flags & ((T1_SIGMA_THIS | T1_PI_THIS) << (ci * 3U))) == 0U &&
            (flags & (T1_SIGMA_NEIGHBOURS << (ci * 3U))) != 0U) {
        if (opj_mqc_raw_decode(mqc)) {
            v = opj_mqc_raw_decode(mqc);
            *datap = v ? -oneplushalf : oneplushalf;
            opj_t1_update_flags(flagsp, ci, v, t1->w + 2, vsc);
        }
        *flagsp |= T1_PI_THIS << (ci * 3U);
    }
}